

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_proxy_isExtensible(JSContext *ctx,JSValue obj)

{
  uint uVar1;
  uint uVar2;
  JSProxyData *argv;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue func_obj;
  JSValue obj_00;
  JSValue JVar5;
  JSValue method;
  
  iVar3 = obj.tag;
  JVar4 = obj.u;
  do {
    JVar5.tag = iVar3;
    JVar5.u.float64 = JVar4.float64;
    argv = get_proxy_method(ctx,&method,JVar5,0x61);
    if (argv == (JSProxyData *)0x0) {
      return -1;
    }
    if ((int)method.tag != 3) {
      func_obj.tag = method.tag;
      func_obj.u.float64 = method.u.float64;
      JVar5 = JS_CallFree(ctx,func_obj,argv->handler,1,&argv->target);
      if ((int)JVar5.tag == 6) {
        return -1;
      }
      uVar1 = JS_ToBoolFree(ctx,JVar5);
      iVar3 = (argv->target).tag;
      if ((int)iVar3 == -1) {
        JVar4.ptr = (argv->target).u.ptr;
        if (*(short *)((long)JVar4.ptr + 6) == 0x29) {
          obj_00.tag = iVar3;
          obj_00.u.ptr = JVar4.ptr;
          uVar2 = js_proxy_isExtensible(ctx,obj_00);
          if ((int)uVar2 < 0) {
            return -1;
          }
        }
        else {
          uVar2 = *(byte *)((long)JVar4.ptr + 5) & 1;
        }
      }
      else {
        uVar2 = 0;
      }
      if (uVar1 != uVar2) {
        JS_ThrowTypeError(ctx,"proxy: inconsistent isExtensible");
        return -1;
      }
      return uVar1;
    }
    iVar3 = (argv->target).tag;
    if ((int)iVar3 != -1) {
      return 0;
    }
    JVar4.ptr = (argv->target).u.ptr;
  } while (*(short *)((long)JVar4.ptr + 6) == 0x29);
  return *(byte *)((long)JVar4.ptr + 5) & 1;
}

Assistant:

static int js_proxy_isExtensible(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret;
    BOOL res;
    int res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_isExtensible);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_IsExtensible(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    res2 = JS_IsExtensible(ctx, s->target);
    if (res2 < 0)
        return res2;
    if (res != res2) {
        JS_ThrowTypeError(ctx, "proxy: inconsistent isExtensible");
        return -1;
    }
    return res;
}